

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cxx
# Opt level: O0

ptr<buffer> nuraft::buffer::alloc(size_t size)

{
  int iVar1;
  stat_mgr *psVar2;
  stat_elem *psVar3;
  out_of_range *this;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  ulong in_RSI;
  stat_mgr *in_RDI;
  ptr<buffer> pVar6;
  any_ptr ptr;
  size_t len;
  any_ptr ptr_1;
  size_t len_1;
  ptr<buffer> *buf;
  buffer *in_stack_fffffffffffffe98;
  stat_elem *in_stack_fffffffffffffea0;
  allocator *in_stack_fffffffffffffea8;
  stat_mgr *in_stack_fffffffffffffeb0;
  allocator *in_stack_fffffffffffffef0;
  undefined8 in_stack_fffffffffffffef8;
  Type type;
  stat_mgr *this_00;
  allocator local_b9;
  string local_b8 [39];
  allocator local_91;
  string local_90 [39];
  allocator local_69;
  string local_68 [39];
  allocator local_41;
  string local_40 [48];
  ulong local_10;
  
  type = (Type)((ulong)in_stack_fffffffffffffef8 >> 0x20);
  this_00 = in_RDI;
  local_10 = in_RSI;
  if ((alloc(unsigned_long)::num_allocs == '\0') &&
     (iVar1 = __cxa_guard_acquire(&alloc(unsigned_long)::num_allocs), iVar1 != 0)) {
    psVar2 = stat_mgr::get_instance();
    type = (Type)((ulong)psVar2 >> 0x20);
    in_stack_fffffffffffffef0 = &local_41;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"num_buffer_allocs",in_stack_fffffffffffffef0);
    psVar3 = stat_mgr::create_stat(this_00,type,(string *)in_stack_fffffffffffffef0);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    alloc::num_allocs = psVar3;
    __cxa_guard_release(&alloc(unsigned_long)::num_allocs);
  }
  if ((alloc(unsigned_long)::amount_allocs == '\0') &&
     (iVar1 = __cxa_guard_acquire(&alloc(unsigned_long)::amount_allocs), iVar1 != 0)) {
    stat_mgr::get_instance();
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,"amount_buffer_allocs",&local_69);
    psVar3 = stat_mgr::create_stat(this_00,type,(string *)in_stack_fffffffffffffef0);
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
    alloc::amount_allocs = psVar3;
    __cxa_guard_release(&alloc(unsigned_long)::amount_allocs);
  }
  if ((alloc(unsigned_long)::num_active == '\0') &&
     (iVar1 = __cxa_guard_acquire(&alloc(unsigned_long)::num_active), iVar1 != 0)) {
    stat_mgr::get_instance();
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_90,"num_active_buffers",&local_91);
    psVar3 = stat_mgr::create_stat(this_00,type,(string *)in_stack_fffffffffffffef0);
    std::__cxx11::string::~string(local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
    alloc::num_active = psVar3;
    __cxa_guard_release(&alloc(unsigned_long)::num_active);
  }
  if ((alloc(unsigned_long)::amount_active == '\0') &&
     (iVar1 = __cxa_guard_acquire(&alloc(unsigned_long)::amount_active), iVar1 != 0)) {
    in_stack_fffffffffffffeb0 = stat_mgr::get_instance();
    in_stack_fffffffffffffea8 = &local_b9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b8,"amount_active_buffers",in_stack_fffffffffffffea8);
    psVar3 = stat_mgr::create_stat(this_00,type,(string *)in_stack_fffffffffffffef0);
    std::__cxx11::string::~string(local_b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_b9);
    alloc::amount_active = psVar3;
    in_stack_fffffffffffffea0 = alloc::amount_active;
    __cxa_guard_release(&alloc(unsigned_long)::amount_active);
  }
  if (local_10 < 0x80000000) {
    stat_elem::operator++(in_stack_fffffffffffffea0,(int)((ulong)in_stack_fffffffffffffe98 >> 0x20))
    ;
    stat_elem::operator++(in_stack_fffffffffffffea0,(int)((ulong)in_stack_fffffffffffffe98 >> 0x20))
    ;
    if (local_10 < 0x8000) {
      operator_new__(local_10 + 4);
      std::shared_ptr<nuraft::buffer>::shared_ptr<nuraft::buffer,void(*)(nuraft::buffer*),void>
                ((shared_ptr<nuraft::buffer> *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                 (_func_void_buffer_ptr *)0x43bd7f);
      stat_elem::operator+=
                ((stat_elem *)in_stack_fffffffffffffeb0,(size_t)in_stack_fffffffffffffea8);
      stat_elem::operator+=
                ((stat_elem *)in_stack_fffffffffffffeb0,(size_t)in_stack_fffffffffffffea8);
      peVar4 = std::__shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>::get
                         ((__shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2> *)this_00);
      *(undefined2 *)peVar4 = (undefined2)local_10;
      *(undefined2 *)(peVar4 + 2) = 0;
      _Var5._M_pi = extraout_RDX_00;
    }
    else {
      operator_new__(local_10 + 8);
      std::shared_ptr<nuraft::buffer>::shared_ptr<nuraft::buffer,void(*)(nuraft::buffer*),void>
                ((shared_ptr<nuraft::buffer> *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                 (_func_void_buffer_ptr *)0x43bc89);
      stat_elem::operator+=
                ((stat_elem *)in_stack_fffffffffffffeb0,(size_t)in_stack_fffffffffffffea8);
      stat_elem::operator+=
                ((stat_elem *)in_stack_fffffffffffffeb0,(size_t)in_stack_fffffffffffffea8);
      peVar4 = std::__shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>::get
                         ((__shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2> *)this_00);
      *(undefined4 *)peVar4 = (undefined4)local_10;
      *(undefined4 *)(peVar4 + 4) = 0;
      *(uint *)peVar4 = *(uint *)peVar4 | 0x80000000;
      _Var5._M_pi = extraout_RDX;
    }
    pVar6.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Var5._M_pi;
    pVar6.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)in_RDI;
    return (ptr<buffer>)pVar6.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>;
  }
  this = (out_of_range *)__cxa_allocate_exception(0x10);
  std::out_of_range::out_of_range(this,"size exceed the max size that nuraft::buffer could support")
  ;
  __cxa_throw(this,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

ptr<buffer> buffer::alloc(const size_t size) {
    static stat_elem& num_allocs = *stat_mgr::get_instance()->create_stat
        (stat_elem::COUNTER, "num_buffer_allocs");
    static stat_elem& amount_allocs = *stat_mgr::get_instance()->create_stat
        (stat_elem::COUNTER, "amount_buffer_allocs");
    static stat_elem& num_active = *stat_mgr::get_instance()->create_stat
        (stat_elem::COUNTER, "num_active_buffers");
    static stat_elem& amount_active = *stat_mgr::get_instance()->create_stat
        (stat_elem::COUNTER, "amount_active_buffers");

    if (size >= 0x80000000) {
        throw std::out_of_range( "size exceed the max size that "
                                 "nuraft::buffer could support" );
    }
    num_allocs++;
    num_active++;

    if (size >= 0x8000) {
        size_t len = size + sizeof(uint) * 2;
        ptr<buffer> buf( reinterpret_cast<buffer*>(new char[len]),
                         &free_buffer );
        amount_allocs += len;
        amount_active += len;

        any_ptr ptr = reinterpret_cast<any_ptr>( buf.get() );
        __init_b_block(ptr, size);
        return buf;
    }

    size_t len = size + sizeof(ushort) * 2;
    ptr<buffer> buf( reinterpret_cast<buffer*>(new char[len]),
                     &free_buffer );
    amount_allocs += len;
    amount_active += len;

    any_ptr ptr = reinterpret_cast<any_ptr>( buf.get() );
    __init_s_block(ptr, size);

    return buf;
}